

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

bool __thiscall flatbuffers::java::JavaGenerator::generate(JavaGenerator *this)

{
  IdlNamer *pIVar1;
  EnumDef *enum_def;
  StructDef *struct_def;
  bool bVar2;
  Parser *pPVar3;
  pointer ppEVar4;
  pointer ppSVar5;
  string enumcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> class_name;
  string one_file_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  one_file_code._M_dataplus._M_p = (pointer)&one_file_code.field_2;
  one_file_code._M_string_length = 0;
  one_file_code.field_2._M_local_buf[0] = '\0';
  pPVar3 = (this->super_BaseGenerator).parser_;
  this->cur_name_space_ = pPVar3->current_namespace_;
  pIVar1 = &this->namer_;
  for (ppEVar4 = (pPVar3->enums_).vec.
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 !=
      (pPVar3->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar4 = ppEVar4 + 1) {
    enumcode._M_string_length = 0;
    enumcode.field_2._M_local_buf[0] = '\0';
    enum_def = *ppEVar4;
    if ((pPVar3->opts).one_file == false) {
      this->cur_name_space_ = (enum_def->super_Definition).defined_namespace;
    }
    enumcode._M_dataplus._M_p = (pointer)&enumcode.field_2;
    GenEnum(this,enum_def,&enumcode);
    if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
      std::__cxx11::string::append((string *)&one_file_code);
    }
    else {
      bVar2 = SaveType(this,(string *)enum_def,(enum_def->super_Definition).defined_namespace,
                       &enumcode,false);
      if (!bVar2) goto LAB_001b085a;
    }
    if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) &&
       (enum_def->is_union == true)) {
      std::__cxx11::string::assign((char *)&enumcode);
      GenEnum_ObjectAPI(this,enum_def,&enumcode);
      (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_50,pIVar1,enum_def);
      std::operator+(&class_name,&local_50,"Union");
      std::__cxx11::string::~string((string *)&local_50);
      if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
        std::__cxx11::string::append((string *)&one_file_code);
      }
      else {
        bVar2 = SaveType(this,&class_name,(enum_def->super_Definition).defined_namespace,&enumcode,
                         false);
        if (!bVar2) goto LAB_001b0850;
      }
      std::__cxx11::string::~string((string *)&class_name);
    }
    std::__cxx11::string::~string((string *)&enumcode);
    pPVar3 = (this->super_BaseGenerator).parser_;
  }
  for (ppSVar5 = (pPVar3->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar5 !=
      (pPVar3->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar5 = ppSVar5 + 1) {
    enumcode._M_string_length = 0;
    enumcode.field_2._M_local_buf[0] = '\0';
    struct_def = *ppSVar5;
    if ((pPVar3->opts).one_file == false) {
      this->cur_name_space_ = (struct_def->super_Definition).defined_namespace;
    }
    enumcode._M_dataplus._M_p = (pointer)&enumcode.field_2;
    GenStruct(this,struct_def,&enumcode,&pPVar3->opts);
    if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
      std::__cxx11::string::append((string *)&one_file_code);
    }
    else {
      bVar2 = SaveType(this,(string *)struct_def,(struct_def->super_Definition).defined_namespace,
                       &enumcode,true);
      if (!bVar2) goto LAB_001b085a;
    }
    if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
      std::__cxx11::string::assign((char *)&enumcode);
      GenStruct_ObjectAPI(this,struct_def,&enumcode);
      (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&class_name,pIVar1,struct_def);
      if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
        std::__cxx11::string::append((string *)&one_file_code);
      }
      else {
        bVar2 = SaveType(this,&class_name,(struct_def->super_Definition).defined_namespace,&enumcode
                         ,true);
        if (!bVar2) goto LAB_001b0850;
      }
      std::__cxx11::string::~string((string *)&class_name);
    }
    std::__cxx11::string::~string((string *)&enumcode);
    pPVar3 = (this->super_BaseGenerator).parser_;
  }
  bVar2 = true;
  if ((pPVar3->opts).one_file == true) {
    bVar2 = SaveType(this,(this->super_BaseGenerator).file_name_,pPVar3->current_namespace_,
                     &one_file_code,true);
  }
LAB_001b0864:
  std::__cxx11::string::~string((string *)&one_file_code);
  return bVar2;
LAB_001b0850:
  std::__cxx11::string::~string((string *)&class_name);
LAB_001b085a:
  std::__cxx11::string::~string((string *)&enumcode);
  bVar2 = false;
  goto LAB_001b0864;
}

Assistant:

bool generate() {
    std::string one_file_code;
    cur_name_space_ = parser_.current_namespace_;

    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      std::string enumcode;
      auto &enum_def = **it;
      if (!parser_.opts.one_file) cur_name_space_ = enum_def.defined_namespace;
      GenEnum(enum_def, enumcode);
      if (parser_.opts.one_file) {
        one_file_code += enumcode;
      } else {
        if (!SaveType(enum_def.name, *enum_def.defined_namespace, enumcode,
                      /* needs_includes= */ false))
          return false;
      }

      if (parser_.opts.generate_object_based_api && enum_def.is_union) {
        enumcode = "";
        GenEnum_ObjectAPI(enum_def, enumcode);
        auto class_name = namer_.Type(enum_def) + "Union";
        if (parser_.opts.one_file) {
          one_file_code += enumcode;
        } else {
          if (!SaveType(class_name, *enum_def.defined_namespace, enumcode,
                        /* needs_includes= */ false))
            return false;
        }
      }
    }

    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      std::string declcode;
      auto &struct_def = **it;
      if (!parser_.opts.one_file)
        cur_name_space_ = struct_def.defined_namespace;
      GenStruct(struct_def, declcode, parser_.opts);
      if (parser_.opts.one_file) {
        one_file_code += declcode;
      } else {
        if (!SaveType(struct_def.name, *struct_def.defined_namespace, declcode,
                      /* needs_includes= */ true))
          return false;
      }

      if (parser_.opts.generate_object_based_api) {
        declcode = "";
        GenStruct_ObjectAPI(struct_def, declcode);
        auto class_name = namer_.ObjectType(struct_def);
        if (parser_.opts.one_file) {
          one_file_code += declcode;
        } else {
          if (!SaveType(class_name, *struct_def.defined_namespace, declcode,
                        /* needs_includes= */ true))
            return false;
        }
      }
    }

    if (parser_.opts.one_file) {
      return SaveType(file_name_, *parser_.current_namespace_, one_file_code,
                      /* needs_includes= */ true);
    }
    return true;
  }